

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
BitSet::toArray(vector<int,_std::allocator<int>_> *__return_storage_ptr__,BitSet *this)

{
  iterator __position;
  undefined8 in_RAX;
  long lVar1;
  ulong uVar2;
  uint uVar3;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = (long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if (((long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - lVar1) * 8 +
      (ulong)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0) {
    uVar3 = 1;
    uVar2 = 0;
    uStack_28 = in_RAX;
    do {
      if ((*(ulong *)(lVar1 + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) != 0) {
        uStack_28 = CONCAT44(uVar3 - 1,(undefined4)uStack_28);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (__return_storage_ptr__,__position,(int *)((long)&uStack_28 + 4));
        }
        else {
          *__position._M_current = uVar3 - 1;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar2 = (ulong)uVar3;
      lVar1 = (long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar3 = uVar3 + 1;
    } while (uVar2 < (ulong)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - lVar1
                     ) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> BitSet::toArray() const
{
	std::vector<int> elems;
	for (unsigned int i=0;i<storage.size();i++) {
		if (storage[i])
			elems.push_back(i);
	}

	return elems;
}